

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O0

CURLcode Curl_headers_cleanup(Curl_easy *data)

{
  void **ppvVar1;
  Curl_header_store *hs;
  Curl_llist_element *n;
  Curl_llist_element *e;
  Curl_easy *data_local;
  
  n = (data->state).httphdrs.head;
  while (n != (Curl_llist_element *)0x0) {
    ppvVar1 = &n->ptr;
    n = n->next;
    (*Curl_cfree)(*ppvVar1);
  }
  headers_init(data);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_headers_cleanup(struct Curl_easy *data)
{
  struct Curl_llist_element *e;
  struct Curl_llist_element *n;

  for(e = data->state.httphdrs.head; e; e = n) {
    struct Curl_header_store *hs = e->ptr;
    n = e->next;
    free(hs);
  }
  headers_init(data);
  return CURLE_OK;
}